

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdICHull.cpp
# Opt level: O1

bool __thiscall
HACD::ICHUll::ComputePointVolume(ICHUll *this,double *totalVolume,bool markVisibleFaces)

{
  pointer *pppCVar1;
  CircularListElement<HACD::TMMTriangle> *pCVar2;
  CircularListElement<HACD::TMMVertex> *pCVar3;
  CircularListElement<HACD::TMMVertex> *pCVar4;
  CircularListElement<HACD::TMMVertex> *pCVar5;
  iterator __position;
  pointer ppCVar6;
  pointer ppCVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  byte bVar14;
  size_t sVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  double dVar30;
  double dVar31;
  undefined1 auVar32 [64];
  CircularListElement<HACD::TMMTriangle> *f;
  CircularListElement<HACD::TMMTriangle> *local_50;
  double local_48;
  double local_40;
  double local_38;
  
  pCVar2 = (this->m_mesh).m_triangles.m_head;
  pCVar3 = (this->m_mesh).m_vertices.m_head;
  dVar29 = (pCVar3->m_data).m_pos.m_data[0];
  dVar30 = (pCVar3->m_data).m_pos.m_data[1];
  dVar31 = (pCVar3->m_data).m_pos.m_data[2];
  *totalVolume = 0.0;
  bVar14 = 0;
  auVar32 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  local_50 = pCVar2;
  local_48 = dVar31;
  local_40 = dVar30;
  local_38 = dVar29;
  do {
    pCVar3 = (local_50->m_data).m_vertices[0];
    pCVar4 = (local_50->m_data).m_vertices[1];
    pCVar5 = (local_50->m_data).m_vertices[2];
    dVar8 = (pCVar4->m_data).m_pos.m_data[0] - dVar29;
    dVar9 = (pCVar4->m_data).m_pos.m_data[1] - dVar30;
    dVar10 = (pCVar4->m_data).m_pos.m_data[2] - dVar31;
    dVar11 = (pCVar5->m_data).m_pos.m_data[0] - dVar29;
    dVar12 = (pCVar5->m_data).m_pos.m_data[1] - dVar30;
    dVar13 = (pCVar5->m_data).m_pos.m_data[2] - dVar31;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = dVar9;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar13;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar12 * dVar10;
    auVar22 = vfmsub231sd_fma(auVar28,auVar22,auVar26);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar10;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar11;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar13 * dVar8;
    auVar18 = vfmsub231sd_fma(auVar27,auVar24,auVar23);
    auVar17._8_8_ = 0;
    auVar17._0_8_ = (pCVar3->m_data).m_pos.m_data[0] - dVar29;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = auVar18._0_8_ * ((pCVar3->m_data).m_pos.m_data[1] - dVar30);
    auVar22 = vfmadd231sd_fma(auVar19,auVar17,auVar22);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = dVar11 * dVar9;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = dVar8;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar12;
    auVar18 = vfmsub231sd_fma(auVar18,auVar21,auVar25);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = (pCVar3->m_data).m_pos.m_data[2] - dVar31;
    auVar22 = vfmadd213sd_fma(auVar18,auVar20,auVar22);
    if (auVar22._0_8_ < -1e-09) {
      auVar22 = vandpd_avx(auVar32._0_16_,auVar22);
      *totalVolume = auVar22._0_8_ + *totalVolume;
      bVar14 = 1;
      if (markVisibleFaces) {
        (local_50->m_data).m_visible = true;
        __position._M_current =
             (this->m_trianglesToDelete).
             super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_trianglesToDelete).
            super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<HACD::CircularListElement<HACD::TMMTriangle>*,std::allocator<HACD::CircularListElement<HACD::TMMTriangle>*>>
          ::_M_realloc_insert<HACD::CircularListElement<HACD::TMMTriangle>*const&>
                    ((vector<HACD::CircularListElement<HACD::TMMTriangle>*,std::allocator<HACD::CircularListElement<HACD::TMMTriangle>*>>
                      *)&this->m_trianglesToDelete,__position,&local_50);
          auVar32 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
          dVar29 = local_38;
          dVar30 = local_40;
          dVar31 = local_48;
        }
        else {
          *__position._M_current = local_50;
          pppCVar1 = &(this->m_trianglesToDelete).
                      super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppCVar1 = *pppCVar1 + 1;
        }
      }
    }
    local_50 = local_50->m_next;
  } while (local_50 != pCVar2);
  ppCVar6 = (this->m_trianglesToDelete).
            super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar7 = (this->m_trianglesToDelete).
            super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  sVar15 = (long)ppCVar7 - (long)ppCVar6 >> 3;
  if (sVar15 == (this->m_mesh).m_triangles.m_size) {
    if (ppCVar7 != ppCVar6) {
      lVar16 = 0;
      do {
        (ppCVar6[lVar16]->m_data).m_visible = false;
        lVar16 = lVar16 + 1;
      } while (sVar15 + (sVar15 == 0) != lVar16);
    }
    bVar14 = 0;
  }
  if (!(bool)(!markVisibleFaces | bVar14)) {
    CircularList<HACD::TMMVertex>::Delete(&(this->m_mesh).m_vertices);
    ppCVar6 = (this->m_trianglesToDelete).
              super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_trianglesToDelete).
        super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppCVar6) {
      (this->m_trianglesToDelete).
      super__Vector_base<HACD::CircularListElement<HACD::TMMTriangle>_*,_std::allocator<HACD::CircularListElement<HACD::TMMTriangle>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppCVar6;
    }
  }
  return (bool)(!markVisibleFaces | bVar14);
}

Assistant:

bool ICHUll::ComputePointVolume(double &totalVolume, bool markVisibleFaces)
    {
        // mark visible faces
        CircularListElement<TMMTriangle> * fHead = m_mesh.GetTriangles().GetHead();
        CircularListElement<TMMTriangle> * f = fHead;
        CircularList<TMMVertex> & vertices = m_mesh.GetVertices();
        CircularListElement<TMMVertex> * vertex0 = vertices.GetHead();
        bool visible = false;
        Vec3<double> pos0 = Vec3<double>(vertex0->GetData().m_pos.X(),
										 vertex0->GetData().m_pos.Y(),
										 vertex0->GetData().m_pos.Z());
        double vol = 0.0;
        totalVolume = 0.0;
		Vec3<double> ver0, ver1, ver2;		
        do 
        {
			ver0.X() = f->GetData().m_vertices[0]->GetData().m_pos.X();
			ver0.Y() = f->GetData().m_vertices[0]->GetData().m_pos.Y();
			ver0.Z() = f->GetData().m_vertices[0]->GetData().m_pos.Z();
			ver1.X() = f->GetData().m_vertices[1]->GetData().m_pos.X();
			ver1.Y() = f->GetData().m_vertices[1]->GetData().m_pos.Y();
			ver1.Z() = f->GetData().m_vertices[1]->GetData().m_pos.Z();
			ver2.X() = f->GetData().m_vertices[2]->GetData().m_pos.X();
			ver2.Y() = f->GetData().m_vertices[2]->GetData().m_pos.Y();
			ver2.Z() = f->GetData().m_vertices[2]->GetData().m_pos.Z();
			vol = Volume(ver0, ver1, ver2, pos0);
			if ( vol < -sc_eps)
			{
				vol = fabs(vol);
				totalVolume += vol;
				if (markVisibleFaces)
				{
					f->GetData().m_visible = true;
					m_trianglesToDelete.push_back(f);
				}
				visible = true;
			}
			f = f->GetNext();
        } 
        while (f != fHead);

		if (m_trianglesToDelete.size() == m_mesh.m_triangles.GetSize())
		{
			for(size_t i = 0; i < m_trianglesToDelete.size(); i++)
			{
				m_trianglesToDelete[i]->GetData().m_visible = false;
			}
			visible = false;
		}
        // if no faces visible from p then p is inside the hull
        if (!visible && markVisibleFaces)
        {
            vertices.Delete();
			m_trianglesToDelete.clear();
            return false;
        }
        return true;
    }